

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O1

string * om::etc::format_timestamp(string *__return_storage_ptr__,uint timestamp_,string *format_)

{
  tm *ptVar1;
  undefined4 in_register_00000034;
  _Put_time<char> __f;
  time_t time;
  stringstream ss;
  time_t local_1b0;
  stringstream local_1a8 [16];
  basic_ostream<char,_std::char_traits<char>_> local_198 [112];
  ios_base local_128 [264];
  
  local_1b0 = 0x5c5b95ab;
  std::__cxx11::stringstream::stringstream(local_1a8);
  ptVar1 = gmtime(&local_1b0);
  __f._M_fmt = *(char **)CONCAT44(in_register_00000034,timestamp_);
  __f._M_tmb = (tm *)ptVar1;
  std::operator<<(local_198,__f);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_timestamp(unsigned timestamp_,
			const std::string& format_ = "%F %T")
        {
		    auto time = (std::time_t) timestamp_;
		    std::stringstream ss;
		    ss << std::put_time(std::gmtime(&time), format_.c_str());
		    return ss.str();
        }